

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O3

void verify_min_dfs(log_multi *b,node *node)

{
  uint32_t *puVar1;
  node *pnVar2;
  ulong uVar3;
  uint uVar4;
  
  if (node->internal == true) {
    pnVar2 = (b->nodes)._begin;
    do {
      uVar3 = (ulong)node->left;
      uVar4 = pnVar2[uVar3].min_count;
      if (pnVar2[node->right].min_count < pnVar2[uVar3].min_count) {
        uVar4 = pnVar2[node->right].min_count;
      }
      if (node->min_count != uVar4) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"badness! ",9);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
        std::ostream::put(-0x18);
        std::ostream::flush();
        display_tree_dfs(b,(b->nodes)._begin,0);
        uVar3 = (ulong)node->left;
        pnVar2 = (b->nodes)._begin;
      }
      verify_min_dfs(b,pnVar2 + uVar3);
      puVar1 = &node->right;
      pnVar2 = (b->nodes)._begin;
      node = pnVar2 + *puVar1;
    } while (pnVar2[*puVar1].internal != false);
  }
  return;
}

Assistant:

void verify_min_dfs(log_multi& b, const node& node)
{
  if (node.internal)
  {
    if (node.min_count != min_left_right(b, node))
    {
      cout << "badness! " << endl;
      display_tree_dfs(b, b.nodes[0], 0);
    }
    verify_min_dfs(b, b.nodes[node.left]);
    verify_min_dfs(b, b.nodes[node.right]);
  }
}